

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::next_token(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  Type TVar2;
  lexer_exception *plVar3;
  ostream *poVar4;
  byte local_2d9;
  Position local_2c0;
  TokenPosition local_2b0;
  Type local_298;
  undefined1 local_291;
  string local_290;
  stringstream local_270 [8];
  stringstream buffer;
  ostream local_260 [380];
  uint local_e4;
  Position local_e0;
  TokenPosition local_d0;
  Type local_b4;
  undefined1 local_b0 [8];
  Token t;
  allocator local_41;
  string local_40;
  bool local_1a;
  bool local_19;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  do {
    while( true ) {
      while( true ) {
        if (this->current_ == this->npos) {
          local_298 = kEOF;
          Position::Position(&local_2c0,&(this->position_).super_Position);
          TokenPosition::TokenPosition(&local_2b0,&local_2c0,0);
          Token::Token(__return_storage_ptr__,&local_298,&local_2b0);
          return __return_storage_ptr__;
        }
        if ((this->in_row_comment_ & 1U) == 0) break;
        while( true ) {
          local_2d9 = 0;
          if (this->current_ != this->npos) {
            bVar1 = Recognition::is_newline(&this->current_);
            local_2d9 = bVar1 ^ 0xff;
          }
          if ((local_2d9 & 1) == 0) break;
          local_19 = false;
          consume(this,&local_19);
        }
        this->in_row_comment_ = false;
      }
      if ((this->in_block_comment_ & 1U) == 0) break;
      while (this->current_ != this->npos) {
        while( true ) {
          bVar1 = false;
          if (this->current_ != this->npos) {
            bVar1 = this->current_ != '*';
          }
          if (!bVar1) break;
          local_1a = false;
          consume(this,&local_1a);
        }
        if (this->current_ == this->npos) {
          t.extra_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
          plVar3 = (lexer_exception *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_40,anon_var_dwarf_32600,&local_41);
          lexer_exception::lexer_exception(plVar3,&this->position_,&local_40);
          t.extra_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
          __cxa_throw(plVar3,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
        }
        match_times((Token *)local_b0,this);
        TVar2 = Token::type((Token *)local_b0);
        if (TVar2 == kRightBlockComment) {
          this->in_block_comment_ = false;
          local_b4 = kRightBlockComment;
          Position::Position(&local_e0,&(this->position_).super_Position);
          TokenPosition::TokenPosition(&local_d0,&local_e0,2);
          Token::Token(__return_storage_ptr__,&local_b4,&local_d0);
        }
        local_e4 = (uint)(TVar2 == kRightBlockComment);
        Token::~Token((Token *)local_b0);
        if (local_e4 != 0) {
          return __return_storage_ptr__;
        }
      }
    }
    switch(this->current_) {
    case '\t':
    case '\n':
    case '\r':
    case ' ':
      skip_whitespace(this);
      break;
    default:
      bVar1 = Recognition::is_letter(&this->current_);
      if (bVar1) {
        match_name(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      bVar1 = Recognition::is_digit(&this->current_);
      if (bVar1) {
        match_digit(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      std::__cxx11::stringstream::stringstream(local_270);
      poVar4 = std::operator<<(local_260,anon_var_dwarf_32619);
      std::operator<<(poVar4,this->current_);
      local_291 = 1;
      plVar3 = (lexer_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      lexer_exception::lexer_exception(plVar3,&this->position_,&local_290);
      local_291 = 0;
      __cxa_throw(plVar3,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
    case '(':
      match_left_paren(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case ')':
      match_right_paren(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '*':
      match_times(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '+':
      match_plus(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case ',':
      match_comma(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '-':
      match_minus(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '/':
      match_divide(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case ';':
      match_semicolon(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '<':
      match_lt(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '=':
      match_equal(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '>':
      match_gt(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '[':
      match_left_bracket(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case ']':
      match_right_bracket(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '{':
      match_left_brace(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case '}':
      match_right_brace(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Token Lexer::next_token() {
    while (current_ != npos) {
        if (in_row_comment_) {  // 在行注释中
            while (current_ != npos && !Recognition::is_newline(current_)) {
                consume(false);
            }
            in_row_comment_ = false;
            continue;
        }
        if (in_block_comment_) {  // 在块注释中
            while (current_ != npos) {
                while (current_ != npos && current_ != '*') {
                    consume(false);
                }
                if (current_ == npos) {
                    throw lexer_exception(position_, "未闭合的注释块");
                } else {
                    Token t = match_times();
                    if (t.type() == Token::Type::kRightBlockComment) {
                        in_block_comment_ = false;
                        return Token(Token::Type::kRightBlockComment, TokenPosition(position_, 2));
                    }
                }
            }
            continue;  // 保证 EOF 会被正确处理
        }

        switch (current_) {
            case ' ':
            case '\t':
            case '\n':
            case '\r':
                skip_whitespace();
                continue;
            case '(': return match_left_paren();
            case ')': return match_right_paren();
            case '[': return match_left_bracket();
            case ']': return match_right_bracket();
            case '{': return match_left_brace();
            case '}': return match_right_brace();
            case ';': return match_semicolon();
            case ',': return match_comma();
            case '=': return match_equal();
            case '+': return match_plus();
            case '-': return match_minus();
            case '*': return match_times();
            case '/': return match_divide();
            case '<': return match_lt();
            case '>': return match_gt();
            default:
                if (Recognition::is_letter(current_)) {
                    return match_name();
                } else if (Recognition::is_digit(current_)) {
                    return match_digit();
                } else {
                    std::stringstream buffer;
                    buffer << "不合法的字符: " << current_;
                    throw lexer_exception(position_, buffer.str());
                }
        }
    }
    return Token(Token::Type::kEOF, TokenPosition(position_, 0));
}